

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approximate_quantile.cpp
# Opt level: O1

AggregateFunction * __thiscall
duckdb::GetTypedApproxQuantileListAggregateFunction<signed_char,signed_char>
          (AggregateFunction *__return_storage_ptr__,duckdb *this,LogicalType *type)

{
  initializer_list<duckdb::LogicalType> __l;
  LogicalType result_type;
  allocator_type local_59;
  LogicalType local_58;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_40;
  LogicalType local_28;
  
  LogicalType::LIST(&local_28,(LogicalType *)this);
  LogicalType::LogicalType(&local_58,(LogicalType *)this);
  __l._M_len = 1;
  __l._M_array = &local_58;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_40,__l,&local_59);
  AggregateFunction::AggregateFunction
            (__return_storage_ptr__,(vector<duckdb::LogicalType,_true> *)&local_40,&local_28,
             AggregateFunction::StateSize<duckdb::ApproxQuantileState>,
             AggregateFunction::
             StateInitialize<duckdb::ApproxQuantileState,duckdb::ApproxQuantileListOperation<signed_char>,(duckdb::AggregateDestructorType)0>
             ,AggregateFunction::
              UnaryScatterUpdate<duckdb::ApproxQuantileState,signed_char,duckdb::ApproxQuantileListOperation<signed_char>>
             ,AggregateFunction::
              StateCombine<duckdb::ApproxQuantileState,duckdb::ApproxQuantileListOperation<signed_char>>
             ,AggregateFunction::
              StateFinalize<duckdb::ApproxQuantileState,duckdb::list_entry_t,duckdb::ApproxQuantileListOperation<signed_char>>
             ,AggregateFunction::
              UnaryUpdate<duckdb::ApproxQuantileState,signed_char,duckdb::ApproxQuantileListOperation<signed_char>>
             ,(bind_aggregate_function_t)0x0,
             AggregateFunction::
             StateDestroy<duckdb::ApproxQuantileState,duckdb::ApproxQuantileListOperation<signed_char>>
             ,(aggregate_statistics_t)0x0,(aggregate_window_t)0x0,(aggregate_serialize_t)0x0,
             (aggregate_deserialize_t)0x0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_40);
  LogicalType::~LogicalType(&local_58);
  LogicalType::~LogicalType(&local_28);
  __return_storage_ptr__->serialize = ApproximateQuantileBindData::Serialize;
  __return_storage_ptr__->deserialize = ApproximateQuantileBindData::Deserialize;
  return __return_storage_ptr__;
}

Assistant:

AggregateFunction GetTypedApproxQuantileListAggregateFunction(const LogicalType &type) {
	using STATE = ApproxQuantileState;
	using OP = ApproxQuantileListOperation<INPUT_TYPE>;
	auto fun = ApproxQuantileListAggregate<STATE, INPUT_TYPE, list_entry_t, OP>(type, type);
	fun.serialize = ApproximateQuantileBindData::Serialize;
	fun.deserialize = ApproximateQuantileBindData::Deserialize;
	return fun;
}